

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcinit.c
# Opt level: O0

void jinit_compress_master(j_compress_ptr cinfo)

{
  long in_RDI;
  j_compress_ptr unaff_retaddr;
  boolean in_stack_0000000c;
  boolean in_stack_0000002c;
  j_compress_ptr in_stack_00000030;
  undefined8 in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  undefined1 uVar1;
  
  jinit_c_master_control
            ((j_compress_ptr)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
             (boolean)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  if (*(int *)(in_RDI + 0x100) == 0) {
    jinit_color_converter(unaff_retaddr);
    jinit_downsampler(unaff_retaddr);
    jinit_c_prep_controller(cinfo,in_stack_0000000c);
  }
  jinit_forward_dct(unaff_retaddr);
  if (*(int *)(in_RDI + 0x104) == 0) {
    if (*(int *)(in_RDI + 0x134) == 0) {
      jinit_huff_encoder((j_compress_ptr)
                         CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
    }
    else {
      jinit_phuff_encoder((j_compress_ptr)
                          CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
    }
  }
  else {
    jinit_arith_encoder((j_compress_ptr)
                        CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  }
  uVar1 = true;
  if (*(int *)(in_RDI + 0xf0) < 2) {
    uVar1 = *(int *)(in_RDI + 0x108) != 0;
  }
  jinit_c_coef_controller(in_stack_00000030,in_stack_0000002c);
  jinit_c_main_controller(unaff_retaddr,(boolean)((ulong)in_RDI >> 0x20));
  jinit_marker_writer((j_compress_ptr)CONCAT17(uVar1,in_stack_fffffffffffffff0));
  (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI);
  (*(code *)**(undefined8 **)(in_RDI + 0x1d0))(in_RDI);
  return;
}

Assistant:

GLOBAL(void)
jinit_compress_master(j_compress_ptr cinfo)
{
  /* Initialize master control (includes parameter checking/processing) */
  jinit_c_master_control(cinfo, FALSE /* full compression */);

  /* Preprocessing */
  if (!cinfo->raw_data_in) {
    jinit_color_converter(cinfo);
    jinit_downsampler(cinfo);
    jinit_c_prep_controller(cinfo, FALSE /* never need full buffer here */);
  }
  /* Forward DCT */
  jinit_forward_dct(cinfo);
  /* Entropy encoding: either Huffman or arithmetic coding. */
  if (cinfo->arith_code) {
#ifdef C_ARITH_CODING_SUPPORTED
    jinit_arith_encoder(cinfo);
#else
    ERREXIT(cinfo, JERR_ARITH_NOTIMPL);
#endif
  } else {
    if (cinfo->progressive_mode) {
#ifdef C_PROGRESSIVE_SUPPORTED
      jinit_phuff_encoder(cinfo);
#else
      ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
    } else
      jinit_huff_encoder(cinfo);
  }

  /* Need a full-image coefficient buffer in any multi-pass mode. */
  jinit_c_coef_controller(cinfo, (boolean)(cinfo->num_scans > 1 ||
                                           cinfo->optimize_coding));
  jinit_c_main_controller(cinfo, FALSE /* never need full buffer here */);

  jinit_marker_writer(cinfo);

  /* We can now tell the memory manager to allocate virtual arrays. */
  (*cinfo->mem->realize_virt_arrays) ((j_common_ptr)cinfo);

  /* Write the datastream header (SOI) immediately.
   * Frame and scan headers are postponed till later.
   * This lets application insert special markers after the SOI.
   */
  (*cinfo->marker->write_file_header) (cinfo);
}